

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_write(Curl_easy *data,char *str,size_t nread,_Bool is_eos)

{
  int *piVar1;
  char cVar2;
  connectdata *pcVar3;
  bool bVar4;
  size_t sVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  long lVar8;
  char *pcVar9;
  CURLcode unaff_EBX;
  char *pcVar10;
  bool bVar11;
  size_t sVar12;
  size_t local_48;
  
  pcVar3 = data->conn;
  if (nread == 0) {
    CVar7 = CURLE_OK;
    local_48 = 0;
  }
  else {
    sVar12 = 0;
    local_48 = 0;
    bVar11 = false;
    CVar7 = CURLE_OK;
    do {
      pcVar10 = *(char **)&(pcVar3->proto).imapc.sasl.state;
      cVar2 = str[sVar12];
      sVar5 = local_48;
      if (cVar2 == '\n') {
        if ((pcVar10 == (char *)0x4) || (pcVar10 == (char *)0x1)) {
          pcVar9 = pcVar10 + 1;
          goto LAB_0014b305;
        }
LAB_0014b303:
        pcVar9 = (char *)0x0;
LAB_0014b305:
        (pcVar3->proto).pop3c.eob = (size_t)pcVar9;
LAB_0014b30c:
        local_48 = sVar5;
        bVar4 = true;
        CVar6 = unaff_EBX;
        if ((pcVar10 != (char *)0x0) && ((pcVar3->proto).ftpc.alternative_to_user <= pcVar10)) {
          pcVar9 = (pcVar3->proto).ftpc.entrypath;
          lVar8 = 0;
          do {
            if (pcVar9 + lVar8 == (char *)0x0) {
              pcVar10 = pcVar10 + lVar8;
              if ((bVar11) && (pcVar10 = pcVar10 + -1, pcVar10 == (char *)0x0)) {
                CVar7 = CURLE_OK;
              }
              else {
                CVar7 = Curl_client_write(data,1,"\r\n.\r\n",(size_t)pcVar10);
              }
              bVar4 = false;
              CVar6 = CVar7;
              if (CVar7 == CURLE_OK) {
                CVar7 = CURLE_OK;
                bVar11 = false;
                bVar4 = true;
                local_48 = sVar12;
                CVar6 = unaff_EBX;
              }
              break;
            }
            (pcVar3->proto).ftpc.entrypath = pcVar9 + lVar8 + -1;
            lVar8 = lVar8 + -1;
          } while (pcVar10 + lVar8 != (char *)0x0);
        }
      }
      else {
        if (cVar2 == '.') {
          if (pcVar10 == (char *)0x2) {
            pcVar9 = (char *)0x3;
            goto LAB_0014b305;
          }
          if (pcVar10 == (char *)0x3) {
            bVar11 = true;
          }
          goto LAB_0014b303;
        }
        if (cVar2 != '\r') goto LAB_0014b303;
        if (pcVar10 == (char *)0x3) {
          pcVar9 = (char *)0x4;
          goto LAB_0014b305;
        }
        if (pcVar10 != (char *)0x0) {
          pcVar9 = (char *)0x1;
          goto LAB_0014b305;
        }
        (pcVar3->proto).pop3c.eob = 1;
        if (sVar12 == 0) goto LAB_0014b30c;
        CVar6 = Curl_client_write(data,1,str + local_48,sVar12 - local_48);
        CVar7 = CURLE_OK;
        sVar5 = sVar12;
        if (CVar6 == CURLE_OK) goto LAB_0014b30c;
        bVar4 = false;
        CVar7 = CVar6;
      }
      if (!bVar4) {
        return CVar6;
      }
      sVar12 = sVar12 + 1;
      unaff_EBX = CVar6;
    } while (sVar12 != nread);
  }
  pcVar10 = (pcVar3->proto).ftpc.alternative_to_user;
  if (pcVar10 == (char *)0x0) {
    if (nread - local_48 != 0) {
      CVar7 = Curl_client_write(data,1,str + local_48,nread - local_48);
      return CVar7;
    }
  }
  else {
    CVar7 = CURLE_OK;
    if (pcVar10 == (char *)0x5) {
      CVar7 = Curl_client_write(data,1,"\r\n.\r\n",2);
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
      (pcVar3->proto).ftpc.alternative_to_user = (char *)0x0;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode pop3_write(struct Curl_easy *data, const char *str,
                           size_t nread, bool is_eos)
{
  /* This code could be made into a special function in the handler struct */
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  bool strip_dot = FALSE;
  size_t last = 0;
  size_t i;
  (void)is_eos;

  /* Search through the buffer looking for the end-of-body marker which is
     5 bytes (0d 0a 2e 0d 0a). Note that a line starting with a dot matches
     the eob so the server will have prefixed it with an extra dot which we
     need to strip out. Additionally the marker could of course be spread out
     over 5 different data chunks. */
  for(i = 0; i < nread; i++) {
    size_t prev = pop3c->eob;

    switch(str[i]) {
    case 0x0d:
      if(pop3c->eob == 0) {
        pop3c->eob++;

        if(i) {
          /* Write out the body part that did not match */
          result = Curl_client_write(data, CLIENTWRITE_BODY, &str[last],
                                     i - last);

          if(result)
            return result;

          last = i;
        }
      }
      else if(pop3c->eob == 3)
        pop3c->eob++;
      else
        /* If the character match was not at position 0 or 3 then restart the
           pattern matching */
        pop3c->eob = 1;
      break;

    case 0x0a:
      if(pop3c->eob == 1 || pop3c->eob == 4)
        pop3c->eob++;
      else
        /* If the character match was not at position 1 or 4 then start the
           search again */
        pop3c->eob = 0;
      break;

    case 0x2e:
      if(pop3c->eob == 2)
        pop3c->eob++;
      else if(pop3c->eob == 3) {
        /* We have an extra dot after the CRLF which we need to strip off */
        strip_dot = TRUE;
        pop3c->eob = 0;
      }
      else
        /* If the character match was not at position 2 then start the search
           again */
        pop3c->eob = 0;
      break;

    default:
      pop3c->eob = 0;
      break;
    }

    /* Did we have a partial match which has subsequently failed? */
    if(prev && prev >= pop3c->eob) {
      /* Strip can only be non-zero for the very first mismatch after CRLF
         and then both prev and strip are equal and nothing will be output
         below */
      while(prev && pop3c->strip) {
        prev--;
        pop3c->strip--;
      }

      if(prev) {
        /* If the partial match was the CRLF and dot then only write the CRLF
           as the server would have inserted the dot */
        if(strip_dot && prev - 1 > 0) {
          result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                     prev - 1);
        }
        else if(!strip_dot) {
          result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                     prev);
        }
        else {
          result = CURLE_OK;
        }

        if(result)
          return result;

        last = i;
        strip_dot = FALSE;
      }
    }
  }

  if(pop3c->eob == POP3_EOB_LEN) {
    /* We have a full match so the transfer is done, however we must transfer
    the CRLF at the start of the EOB as this is considered to be part of the
    message as per RFC-1939, sect. 3 */
    result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)POP3_EOB, 2);

    k->keepon &= ~KEEP_RECV;
    pop3c->eob = 0;

    return result;
  }

  if(pop3c->eob)
    /* While EOB is matching nothing should be output */
    return CURLE_OK;

  if(nread - last) {
    result = Curl_client_write(data, CLIENTWRITE_BODY, &str[last],
                               nread - last);
  }

  return result;
}